

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

void __thiscall t_javame_generator::init_generator(t_javame_generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_program *this_00;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  char *pcVar9;
  size_type *psVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dir;
  string subdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  string local_b8;
  char *local_98;
  long local_90;
  char local_88 [16];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  t_javame_generator *local_58;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_b8,this);
  iVar3 = mkdir(local_b8._M_dataplus._M_p,0x1ff);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_f8,this);
      std::__cxx11::string::string
                ((string *)&local_98,local_f8._M_dataplus._M_p,(allocator *)&local_d8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_b8._M_dataplus._M_p = (pointer)*plVar8;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_b8._M_dataplus._M_p == psVar10) {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8.field_2._8_8_ = plVar8[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar10;
      }
      local_b8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pcVar9 = strerror(*piVar4);
      std::operator+(pbVar7,&local_b8,pcVar9);
      __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  this_00 = (this->super_t_oop_generator).super_t_generator.program_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"java","");
  t_program::get_namespace(&local_b8,this_00,&local_50);
  std::__cxx11::string::operator=((string *)&this->package_name_,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar2 = (this->package_name_)._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + (this->package_name_)._M_string_length);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_98,this);
  local_58 = this;
  lVar5 = std::__cxx11::string::find((char *)&local_b8,0x3a9598,0);
  if (lVar5 != -1) {
    paVar1 = &local_f8.field_2;
    do {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_98,local_98 + local_90);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_b8);
      uVar11 = 0xf;
      if (local_d8 != local_c8) {
        uVar11 = local_c8[0];
      }
      if (uVar11 < (ulong)(local_70 + local_d0)) {
        uVar11 = 0xf;
        if (local_78 != local_68) {
          uVar11 = local_68[0];
        }
        if (uVar11 < (ulong)(local_70 + local_d0)) goto LAB_0027032b;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_0027032b:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78);
      }
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8.field_2._8_8_ = puVar6[3];
        local_f8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_f8._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      iVar3 = mkdir(local_98,0x1ff);
      if (iVar3 == -1) {
        piVar4 = __errno_location();
        if (*piVar4 != 0x11) {
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::__cxx11::string::string((string *)&local_d8,local_98,(allocator *)&local_78);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_f8._M_dataplus._M_p = (pointer)*plVar8;
          psVar10 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_f8._M_dataplus._M_p == psVar10) {
            local_f8.field_2._M_allocated_capacity = *psVar10;
            local_f8.field_2._8_8_ = plVar8[3];
            local_f8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar10;
          }
          local_f8._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          pcVar9 = strerror(*piVar4);
          std::operator+(pbVar7,&local_f8,pcVar9);
          __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      }
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_b8);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      lVar5 = std::__cxx11::string::find((char *)&local_b8,0x3a9598,0);
    } while (lVar5 != -1);
  }
  if (local_b8._M_string_length != 0) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_98,local_98 + local_90);
    std::__cxx11::string::append((char *)&local_d8);
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
    paVar1 = &local_f8.field_2;
    psVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8.field_2._8_8_ = puVar6[3];
      local_f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_f8._M_string_length = puVar6[1];
    *puVar6 = psVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8);
    }
    iVar3 = mkdir(local_98,0x1ff);
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0x11) {
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&local_d8,local_98,(allocator *)&local_78);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8._M_dataplus._M_p = (pointer)*plVar8;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_f8._M_dataplus._M_p == psVar10) {
          local_f8.field_2._M_allocated_capacity = *psVar10;
          local_f8.field_2._8_8_ = plVar8[3];
          local_f8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar10;
        }
        local_f8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pcVar9 = strerror(*piVar4);
        std::operator+(pbVar7,&local_f8,pcVar9);
        __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_58->package_dir_);
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_javame_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());
  package_name_ = program_->get_namespace("java");

  string dir = package_name_;
  string subdir = get_out_dir();
  string::size_type loc;
  while ((loc = dir.find(".")) != string::npos) {
    subdir = subdir + "/" + dir.substr(0, loc);
    MKDIR(subdir.c_str());
    dir = dir.substr(loc + 1);
  }
  if (dir.size() > 0) {
    subdir = subdir + "/" + dir;
    MKDIR(subdir.c_str());
  }

  package_dir_ = subdir;
}